

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,false,true,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int64_t *piVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  idx_t iVar15;
  ulong uVar16;
  sel_t sVar17;
  long lVar18;
  int64_t lmonths;
  long lVar19;
  int64_t lmicros;
  int64_t ldays;
  interval_t *input;
  
  if (count + 0x3f < 0x40) {
    iVar15 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar15 = 0;
    lVar18 = 0;
    uVar7 = 0;
    uVar12 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = puVar1[uVar7];
      }
      uVar6 = uVar12 + 0x40;
      if (count <= uVar12 + 0x40) {
        uVar6 = count;
      }
      uVar16 = uVar12;
      if (uVar8 == 0xffffffffffffffff) {
        if (uVar12 < uVar6) {
          psVar2 = sel->sel_vector;
          lVar9 = rdata->micros;
          lVar14 = (long)rdata->days + lVar9 / 86400000000;
          lVar11 = lVar14 % 0x1e;
          lVar14 = (long)rdata->months + lVar14 / 0x1e;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          piVar10 = &ldata[uVar12].micros;
          do {
            uVar8 = uVar12;
            if (psVar2 != (sel_t *)0x0) {
              uVar8 = (ulong)psVar2[uVar12];
            }
            lVar19 = (long)*(int32_t *)((long)piVar10 + -4) + *piVar10 / 86400000000;
            lVar13 = lVar19 % 0x1e;
            lVar19 = (long)((interval_t *)(piVar10 + -1))->months + lVar19 / 0x1e;
            if (lVar19 < lVar14) {
LAB_00449e75:
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (lVar19 <= lVar14) {
                if (lVar13 < lVar11) goto LAB_00449e75;
                bVar5 = lVar9 % 86400000000 <= *piVar10 % 86400000000 || lVar11 < lVar13;
              }
            }
            psVar3[iVar15] = (sel_t)uVar8;
            iVar15 = iVar15 + bVar5;
            psVar4[lVar18] = (sel_t)uVar8;
            lVar18 = lVar18 + (ulong)(bVar5 ^ 1);
            uVar12 = uVar12 + 1;
            piVar10 = piVar10 + 2;
            uVar16 = uVar12;
          } while (uVar6 != uVar12);
        }
      }
      else if (uVar8 == 0) {
        uVar16 = uVar6;
        if (uVar12 < uVar6) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar17 = (sel_t)uVar12;
            if (psVar2 != (sel_t *)0x0) {
              sVar17 = psVar2[uVar12];
            }
            psVar3[lVar18] = sVar17;
            lVar18 = lVar18 + 1;
            uVar12 = uVar12 + 1;
          } while (uVar6 != uVar12);
        }
      }
      else if (uVar12 < uVar6) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar4 = false_sel->sel_vector;
        piVar10 = &ldata[uVar12].micros;
        uVar16 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar17 = (int)uVar12 + (int)uVar16;
          }
          else {
            sVar17 = psVar2[uVar12 + uVar16];
          }
          if ((uVar8 >> (uVar16 & 0x3f) & 1) == 0) {
LAB_0044a019:
            bVar5 = false;
          }
          else {
            lVar9 = (long)rdata->days + rdata->micros / 86400000000;
            lVar11 = lVar9 % 0x1e;
            lVar19 = (long)rdata->months + lVar9 / 0x1e;
            lVar9 = (long)*(int32_t *)((long)piVar10 + -4) + *piVar10 / 86400000000;
            lVar14 = lVar9 % 0x1e;
            lVar9 = (long)((interval_t *)(piVar10 + -1))->months + lVar9 / 0x1e;
            if (lVar9 < lVar19) {
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (lVar9 <= lVar19) {
                if (lVar14 < lVar11) goto LAB_0044a019;
                bVar5 = rdata->micros % 86400000000 <= *piVar10 % 86400000000 || lVar11 < lVar14;
              }
            }
          }
          psVar3[iVar15] = sVar17;
          iVar15 = iVar15 + bVar5;
          psVar4[lVar18] = sVar17;
          lVar18 = (ulong)(bVar5 ^ 1) + lVar18;
          uVar16 = uVar16 + 1;
          piVar10 = piVar10 + 2;
        } while ((uVar12 - uVar6) + uVar16 != 0);
        uVar16 = uVar12 + uVar16;
      }
      uVar7 = uVar7 + 1;
      uVar12 = uVar16;
    } while (uVar7 != count + 0x3f >> 6);
  }
  return iVar15;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}